

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

bool __thiscall ArgsManager::IsArgSet(ArgsManager *this,string *strArg)

{
  long in_FS_OFFSET;
  SettingsValue local_70;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetSetting(&local_70,this,strArg);
  UniValue::~UniValue(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_70.typ != VNULL;
  }
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::IsArgSet(const std::string& strArg) const
{
    return !GetSetting(strArg).isNull();
}